

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFEmbeddedFileDocumentHelper.cc
# Opt level: O2

bool __thiscall
QPDFEmbeddedFileDocumentHelper::removeEmbeddedFile
          (QPDFEmbeddedFileDocumentHelper *this,string *name)

{
  QPDFNameTreeObjectHelper *this_00;
  QPDF *this_01;
  bool bVar1;
  bool bVar2;
  pointer pTVar3;
  QPDFObjGen og;
  QPDFObjectHandle *__filename;
  QPDFObjectHandle oh;
  iterator iter;
  QPDFObjectHandle QStack_b8;
  iterator local_a8;
  iterator local_60;
  
  this_00 = (((this->m).
              super___shared_ptr<QPDFEmbeddedFileDocumentHelper::Members,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr)->embedded_files).
            super___shared_ptr<QPDFNameTreeObjectHelper,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (this_00 == (QPDFNameTreeObjectHelper *)0x0) {
    bVar1 = false;
  }
  else {
    QPDFNameTreeObjectHelper::find(&local_60,this_00,name,false);
    QPDFNameTreeObjectHelper::end
              (&local_a8,
               (((this->m).
                 super___shared_ptr<QPDFEmbeddedFileDocumentHelper::Members,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr)->embedded_files).
               super___shared_ptr<QPDFNameTreeObjectHelper,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    bVar1 = QPDFNameTreeObjectHelper::iterator::operator==(&local_60,&local_a8);
    QPDFNameTreeObjectHelper::iterator::~iterator(&local_a8);
    if (!bVar1) {
      pTVar3 = QPDFNameTreeObjectHelper::iterator::operator->[abi_cxx11_(&local_60);
      __filename = &pTVar3->second;
      std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                ((__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&local_a8,
                 (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)__filename);
      QPDFNameTreeObjectHelper::iterator::remove(&local_60,(char *)__filename);
      bVar2 = QPDFObjectHandle::isIndirect((QPDFObjectHandle *)&local_a8);
      if (bVar2) {
        this_01 = (this->super_QPDFDocumentHelper).qpdf;
        og = QPDFObjectHandle::getObjGen((QPDFObjectHandle *)&local_a8);
        QPDFObjectHandle::newNull();
        QPDF::replaceObject(this_01,og,&QStack_b8);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&QStack_b8.super_BaseHandle.obj.
                    super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      }
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_a8.impl);
    }
    bVar1 = !bVar1;
    QPDFNameTreeObjectHelper::iterator::~iterator(&local_60);
  }
  return bVar1;
}

Assistant:

bool
QPDFEmbeddedFileDocumentHelper::removeEmbeddedFile(std::string const& name)
{
    if (!hasEmbeddedFiles()) {
        return false;
    }
    auto iter = m->embedded_files->find(name);
    if (iter == m->embedded_files->end()) {
        return false;
    }
    auto oh = iter->second;
    iter.remove();
    if (oh.isIndirect()) {
        this->qpdf.replaceObject(oh.getObjGen(), QPDFObjectHandle::newNull());
    }

    return true;
}